

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageStatement
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  int path2;
  bool bVar1;
  bool bVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *message_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *enum_type;
  MessageOptions *options;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *oneof_decl;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *field;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  LocationRecorder location;
  
  text._M_str = ";";
  text._M_len = 1;
  bVar1 = TryConsumeEndOfDeclaration(this,text,(LocationRecorder *)0x0);
  bVar2 = true;
  if (!bVar1) {
    text_00._M_str = "message";
    text_00._M_len = 7;
    bVar1 = LookingAt(this,text_00);
    if (bVar1) {
      LocationRecorder::LocationRecorder
                (&location,message_location,3,*(int *)((long)&message->field_0 + 0x28));
      message_00 = internal::RepeatedPtrFieldBase::
                   Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                             (&(message->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase);
      bVar2 = ParseMessageDefinition(this,message_00,&location,containing_file);
    }
    else {
      text_01._M_str = "enum";
      text_01._M_len = 4;
      bVar1 = LookingAt(this,text_01);
      if (bVar1) {
        LocationRecorder::LocationRecorder
                  (&location,message_location,4,*(int *)((long)&message->field_0 + 0x40));
        enum_type = internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                              (&(message->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase);
        bVar2 = ParseEnumDefinition(this,enum_type,&location,containing_file);
      }
      else {
        text_02._M_str = "extensions";
        text_02._M_len = 10;
        bVar1 = LookingAt(this,text_02);
        if (bVar1) {
          LocationRecorder::LocationRecorder(&location,message_location,5);
          bVar2 = ParseExtensions(this,message,&location,containing_file);
        }
        else {
          text_03._M_str = "reserved";
          text_03._M_len = 8;
          bVar1 = LookingAt(this,text_03);
          if (bVar1) {
            bVar1 = ParseReserved(this,message,message_location);
            return bVar1;
          }
          text_04._M_str = "extend";
          text_04._M_len = 6;
          bVar1 = LookingAt(this,text_04);
          if (bVar1) {
            LocationRecorder::LocationRecorder(&location,message_location,6);
            bVar2 = ParseExtend(this,&(message->field_0)._impl_.extension_,
                                &(message->field_0)._impl_.nested_type_,message_location,3,&location
                                ,containing_file);
          }
          else {
            text_05._M_str = "option";
            text_05._M_len = 6;
            bVar1 = LookingAt(this,text_05);
            if (bVar1) {
              LocationRecorder::LocationRecorder(&location,message_location,7);
              options = DescriptorProto::mutable_options(message);
              bVar2 = ParseOption(this,&options->super_Message,&location,containing_file,
                                  OPTION_STATEMENT);
            }
            else {
              text_06._M_str = "oneof";
              text_06._M_len = 5;
              bVar1 = LookingAt(this,text_06);
              if (bVar1) {
                path2 = *(int *)((long)&message->field_0 + 0x88);
                LocationRecorder::LocationRecorder(&location,message_location,8,path2);
                oneof_decl = internal::RepeatedPtrFieldBase::
                             Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                                       (&(message->field_0)._impl_.oneof_decl_.
                                         super_RepeatedPtrFieldBase);
                bVar2 = ParseOneof(this,oneof_decl,message,path2,&location,message_location,
                                   containing_file);
              }
              else {
                LocationRecorder::LocationRecorder
                          (&location,message_location,2,*(int *)((long)&message->field_0 + 0x10));
                field = internal::RepeatedPtrFieldBase::
                        Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                  (&(message->field_0)._impl_.field_.super_RepeatedPtrFieldBase);
                bVar2 = ParseMessageField(this,field,&(message->field_0)._impl_.nested_type_,
                                          message_location,3,&location,containing_file);
              }
            }
          }
        }
      }
    }
    LocationRecorder::~LocationRecorder(&location);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseMessageStatement(DescriptorProto* message,
                                   const LocationRecorder& message_location,
                                   const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", nullptr)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kNestedTypeFieldNumber,
                              message->nested_type_size());
    return ParseMessageDefinition(message->add_nested_type(), location,
                                  containing_file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kEnumTypeFieldNumber,
                              message->enum_type_size());
    return ParseEnumDefinition(message->add_enum_type(), location,
                               containing_file);
  } else if (LookingAt("extensions")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionRangeFieldNumber);
    return ParseExtensions(message, location, containing_file);
  } else if (LookingAt("reserved")) {
    return ParseReserved(message, message_location);
  } else if (LookingAt("extend")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionFieldNumber);
    return ParseExtend(message->mutable_extension(),
                       message->mutable_nested_type(), message_location,
                       DescriptorProto::kNestedTypeFieldNumber, location,
                       containing_file);
  } else if (LookingAt("option")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kOptionsFieldNumber);
    return ParseOption(message->mutable_options(), location, containing_file,
                       OPTION_STATEMENT);
  } else if (LookingAt("oneof")) {
    int oneof_index = message->oneof_decl_size();
    LocationRecorder oneof_location(
        message_location, DescriptorProto::kOneofDeclFieldNumber, oneof_index);

    return ParseOneof(message->add_oneof_decl(), message, oneof_index,
                      oneof_location, message_location, containing_file);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kFieldFieldNumber,
                              message->field_size());
    return ParseMessageField(
        message->add_field(), message->mutable_nested_type(), message_location,
        DescriptorProto::kNestedTypeFieldNumber, location, containing_file);
  }
}